

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmtowav.c
# Opt level: O0

void puts_uint16_le(uint16_t i,FILE *f)

{
  FILE *in_RSI;
  undefined2 in_DI;
  char *c;
  undefined1 local_2;
  undefined1 uStack_1;
  
  local_2 = (char)in_DI;
  putc((int)local_2,in_RSI);
  uStack_1 = (char)((ushort)in_DI >> 8);
  putc((int)uStack_1,in_RSI);
  return;
}

Assistant:

void puts_uint16_le(uint16_t i, FILE* f) {
	char* c = (char*)(&i);

	if(XM_BIG_ENDIAN) {
		putc(c[1], f);
		putc(c[0], f);
	} else {
		putc(c[0], f);
		putc(c[1], f);
	}
}